

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O2

void __thiscall cppcms::http::context::async_flush_output(context *this,handler *h)

{
  io_mode_type iVar1;
  cppcms_error *this_00;
  allocator local_39;
  string local_38;
  
  iVar1 = http::response::io_mode
                    ((((this->d).ptr_)->response)._M_t.
                     super___uniq_ptr_impl<cppcms::http::response,_std::default_delete<cppcms::http::response>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cppcms::http::response_*,_std::default_delete<cppcms::http::response>_>
                     .super__Head_base<0UL,_cppcms::http::response_*,_false>._M_head_impl);
  if (iVar1 != asynchronous) {
    iVar1 = http::response::io_mode
                      ((((this->d).ptr_)->response)._M_t.
                       super___uniq_ptr_impl<cppcms::http::response,_std::default_delete<cppcms::http::response>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cppcms::http::response_*,_std::default_delete<cppcms::http::response>_>
                       .super__Head_base<0UL,_cppcms::http::response_*,_false>._M_head_impl);
    if (iVar1 != asynchronous_raw) {
      this_00 = (cppcms_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_38,
                 "Can\'t use asynchronouse operations when I/O mode is synchronous",&local_39);
      cppcms_error::cppcms_error(this_00,&local_38);
      __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  cppcms::impl::cgi::connection::async_write_response
            ((this->conn_).
             super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (((this->d).ptr_)->response)._M_t.
             super___uniq_ptr_impl<cppcms::http::response,_std::default_delete<cppcms::http::response>_>
             ._M_t.
             super__Tuple_impl<0UL,_cppcms::http::response_*,_std::default_delete<cppcms::http::response>_>
             .super__Head_base<0UL,_cppcms::http::response_*,_false>._M_head_impl,false,h);
  return;
}

Assistant:

void context::async_flush_output(context::handler const &h)
{
	if(response().io_mode() != http::response::asynchronous && response().io_mode()!=http::response::asynchronous_raw) {
		throw cppcms_error("Can't use asynchronouse operations when I/O mode is synchronous");
	}
	conn_->async_write_response(
		response(),
		false,
		h);
}